

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetTxInfoByHandle
              (void *handle,void *tx_data_handle,char **txid,char **wtxid,uint32_t *size,
              uint32_t *vsize,uint32_t *weight,uint32_t *version,uint32_t *locktime)

{
  AbstractTransaction *this;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  char *pcVar6;
  char *pcVar7;
  CfdException *this_00;
  ConfidentialTransactionContext *tx;
  bool is_bitcoin;
  string local_100;
  Txid local_e0;
  void *local_c0;
  char **local_b8;
  char **local_b0;
  char *work_txid;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  string temp_txid;
  char *work_wtxid;
  string temp_wtxid;
  
  work_txid = (char *)0x0;
  local_c0 = handle;
  local_b8 = wtxid;
  local_b0 = txid;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&temp_txid,"TransactionData",(allocator *)&temp_wtxid);
  cfd::capi::CheckBuffer(tx_data_handle,&temp_txid);
  std::__cxx11::string::~string((string *)&temp_txid);
  temp_txid._M_dataplus._M_p = (pointer)&temp_txid.field_2;
  temp_txid._M_string_length = 0;
  temp_txid.field_2._M_local_buf[0] = '\0';
  temp_wtxid._M_dataplus._M_p = (pointer)&temp_wtxid.field_2;
  temp_wtxid._M_string_length = 0;
  temp_wtxid.field_2._M_local_buf[0] = '\0';
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&is_bitcoin);
  this = *(AbstractTransaction **)((long)tx_data_handle + 0x18);
  if (this != (AbstractTransaction *)0x0) {
    if (is_bitcoin == true) {
      cfd::core::AbstractTransaction::GetTxid(&local_e0,this);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_100,&local_e0);
      std::__cxx11::string::_M_assign((string *)&temp_txid);
      std::__cxx11::string::~string((string *)&local_100);
      cfd::core::Txid::~Txid(&local_e0);
      cfd::core::AbstractTransaction::GetWitnessHash((ByteData256 *)&local_a0,this);
      cfd::core::Txid::Txid(&local_e0,(ByteData256 *)&local_a0);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_100,&local_e0);
      std::__cxx11::string::_M_assign((string *)&temp_wtxid);
      std::__cxx11::string::~string((string *)&local_100);
      cfd::core::Txid::~Txid(&local_e0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
      uVar1 = (*this->_vptr_AbstractTransaction[4])(this);
      uVar2 = (*this->_vptr_AbstractTransaction[5])(this);
      uVar3 = (*this->_vptr_AbstractTransaction[6])(this);
      uVar4 = cfd::core::AbstractTransaction::GetVersion(this);
      uVar5 = cfd::core::AbstractTransaction::GetLockTime(this);
    }
    else {
      cfd::core::AbstractTransaction::GetTxid(&local_e0,this);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_100,&local_e0);
      std::__cxx11::string::_M_assign((string *)&temp_txid);
      std::__cxx11::string::~string((string *)&local_100);
      cfd::core::Txid::~Txid(&local_e0);
      cfd::core::AbstractTransaction::GetWitnessHash((ByteData256 *)&local_a0,this);
      cfd::core::Txid::Txid(&local_e0,(ByteData256 *)&local_a0);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_100,&local_e0);
      std::__cxx11::string::_M_assign((string *)&temp_wtxid);
      std::__cxx11::string::~string((string *)&local_100);
      cfd::core::Txid::~Txid(&local_e0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
      uVar1 = (*this->_vptr_AbstractTransaction[4])(this);
      uVar2 = (*this->_vptr_AbstractTransaction[5])(this);
      uVar3 = (*this->_vptr_AbstractTransaction[6])(this);
      uVar4 = cfd::core::AbstractTransaction::GetVersion(this);
      uVar5 = cfd::core::AbstractTransaction::GetLockTime(this);
    }
    if (local_b0 == (char **)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = cfd::capi::CreateString(&temp_txid);
      work_txid = pcVar6;
    }
    if (local_b8 == (char **)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = cfd::capi::CreateString(&temp_wtxid);
    }
    if (size != (uint32_t *)0x0) {
      *size = uVar1;
    }
    if (vsize != (uint32_t *)0x0) {
      *vsize = uVar2;
    }
    if (weight != (uint32_t *)0x0) {
      *weight = uVar3;
    }
    if (version != (uint32_t *)0x0) {
      *version = uVar4;
    }
    if (locktime != (uint32_t *)0x0) {
      *locktime = uVar5;
    }
    if (pcVar6 != (char *)0x0) {
      *local_b0 = pcVar6;
    }
    if (pcVar7 != (char *)0x0) {
      *local_b8 = pcVar7;
    }
    std::__cxx11::string::~string((string *)&temp_wtxid);
    std::__cxx11::string::~string((string *)&temp_txid);
    return 0;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_100,"Invalid handle state. tx is null",(allocator *)&local_e0);
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalStateError,&local_100);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInfoByHandle(
    void* handle, void* tx_data_handle, char** txid, char** wtxid,
    uint32_t* size, uint32_t* vsize, uint32_t* weight, uint32_t* version,
    uint32_t* locktime) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_txid = nullptr;
  char* work_wtxid = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    uint32_t temp_size = 0;
    uint32_t temp_vsize = 0;
    uint32_t temp_weight = 0;
    uint32_t temp_version = 0;
    uint32_t temp_locktime = 0;
    std::string temp_txid;
    std::string temp_wtxid;
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      temp_txid = tx->GetTxid().GetHex();
      temp_wtxid = Txid(tx->GetWitnessHash()).GetHex();
      temp_size = tx->GetTotalSize();
      temp_vsize = tx->GetVsize();
      temp_weight = tx->GetWeight();
      temp_version = tx->GetVersion();
      temp_locktime = tx->GetLockTime();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      temp_txid = tx->GetTxid().GetHex();
      temp_wtxid = Txid(tx->GetWitnessHash()).GetHex();
      temp_size = tx->GetTotalSize();
      temp_vsize = tx->GetVsize();
      temp_weight = tx->GetWeight();
      temp_version = tx->GetVersion();
      temp_locktime = tx->GetLockTime();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (txid != nullptr) work_txid = CreateString(temp_txid);
    if (wtxid != nullptr) work_wtxid = CreateString(temp_wtxid);
    if (size != nullptr) *size = temp_size;
    if (vsize != nullptr) *vsize = temp_vsize;
    if (weight != nullptr) *weight = temp_weight;
    if (version != nullptr) *version = temp_version;
    if (locktime != nullptr) *locktime = temp_locktime;

    if (work_txid != nullptr) *txid = work_txid;
    if (work_wtxid != nullptr) *wtxid = work_wtxid;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_wtxid);
  return result;
}